

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

void __thiscall
chaiscript::Type_Conversions::add_conversion
          (Type_Conversions *this,shared_ptr<chaiscript::detail::Type_Conversion_Base> *conversion)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  undefined8 uVar4;
  type_info *ptVar5;
  type_info *ptVar6;
  const_iterator cVar7;
  undefined8 *puVar8;
  long lVar9;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  _Alloc_node __an;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  unique_lock<std::shared_mutex> local_40;
  _Alloc_node local_30;
  
  local_40._M_owns = false;
  local_40._M_device = &this->m_mutex;
  std::unique_lock<std::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  peVar1 = (conversion->
           super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  cVar7 = find_bidir(this,&peVar1->m_to,&peVar1->m_from);
  if ((_Rb_tree_header *)cVar7._M_node == &(this->m_conversions)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
    ::_M_insert_unique<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>const&>
              ((_Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
                *)&this->m_conversions,conversion);
    peVar1 = (conversion->
             super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    local_58 = (peVar1->m_to).m_bare_type_info;
    uStack_50 = (peVar1->m_from).m_bare_type_info;
    lVar9 = 0;
    local_30._M_t = &(this->m_convertableTypes)._M_t;
    do {
      std::
      _Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>
      ::
      _M_insert_unique_<std::type_info_const*const&,std::_Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>::_Alloc_node>
                ((_Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>
                  *)&this->m_convertableTypes,
                 (const_iterator)&(this->m_convertableTypes)._M_t._M_impl.super__Rb_tree_header,
                 (type_info **)((long)&local_58 + lVar9),&local_30);
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x10);
    LOCK();
    (this->m_num_types).super___atomic_base<unsigned_long>._M_i =
         (this->m_convertableTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    UNLOCK();
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_40);
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x50);
  peVar1 = (conversion->
           super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  ptVar2 = (peVar1->m_to).m_type_info;
  ptVar3 = (peVar1->m_to).m_bare_type_info;
  uVar4 = *(undefined8 *)&(peVar1->m_to).m_flags;
  local_48 = *(undefined8 *)&(peVar1->m_from).m_flags;
  ptVar5 = (peVar1->m_from).m_type_info;
  ptVar6 = (peVar1->m_from).m_bare_type_info;
  *puVar8 = &PTR__bad_cast_003d0858;
  local_58._0_4_ = SUB84(ptVar5,0);
  local_58._4_4_ = (undefined4)((ulong)ptVar5 >> 0x20);
  uStack_50._0_4_ = SUB84(ptVar6,0);
  uStack_50._4_4_ = (undefined4)((ulong)ptVar6 >> 0x20);
  *(undefined4 *)(puVar8 + 1) = (undefined4)local_58;
  *(undefined4 *)((long)puVar8 + 0xc) = local_58._4_4_;
  *(undefined4 *)(puVar8 + 2) = (undefined4)uStack_50;
  *(undefined4 *)((long)puVar8 + 0x14) = uStack_50._4_4_;
  puVar8[3] = local_48;
  puVar8[4] = ptVar3;
  puVar8[5] = 0x2b;
  puVar8[6] = "Trying to re-insert an existing conversion!";
  *puVar8 = &PTR__bad_cast_003d0830;
  puVar8[7] = ptVar2;
  puVar8[8] = ptVar3;
  puVar8[9] = uVar4;
  local_58 = ptVar5;
  uStack_50 = ptVar6;
  __cxa_throw(puVar8,&exception::conversion_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

void add_conversion(const std::shared_ptr<detail::Type_Conversion_Base> &conversion) {
      chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
      if (find_bidir(conversion->to(), conversion->from()) != m_conversions.end()) {
        throw exception::conversion_error(conversion->to(), conversion->from(), "Trying to re-insert an existing conversion!");
      }
      m_conversions.insert(conversion);
      m_convertableTypes.insert({conversion->to().bare_type_info(), conversion->from().bare_type_info()});
      m_num_types = m_convertableTypes.size();
    }